

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O3

int find_ordering(int n_row,int n_col,int Alen,Colamd_Row *Row,Colamd_Col *Col,int *A,int *head,
                 int n_col2,int max_deg,int pfree,int aggressive)

{
  Colamd_Col *pCVar1;
  Colamd_Col *pCVar2;
  Colamd_Col *pCVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  anon_union_4_3_eabe2f71_for_shared3 aVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int *piVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  anon_union_4_2_a9a27649_for_shared2 *paVar19;
  anon_union_4_3_eabe2f71_for_shared3 *paVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  anon_union_4_2_db423fdf_for_shared4 *paVar26;
  uint uVar27;
  long lVar28;
  int iVar29;
  anon_union_4_2_a9a27649_for_shared2 *paVar30;
  int *piVar31;
  int *piVar32;
  long lVar33;
  bool bVar34;
  int local_c0;
  int local_b8;
  int local_b4;
  int *local_a0;
  int *local_88;
  uint local_7c;
  
  if (0 < n_row) {
    lVar12 = 0;
    do {
      if (-1 < *(int *)((long)&Row->shared2 + lVar12)) {
        *(undefined4 *)((long)&Row->shared2 + lVar12) = 0;
      }
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uint)n_row << 4 != lVar12);
  }
  if (n_col2 < 1) {
    iVar18 = 0;
  }
  else {
    local_7c = pfree;
    lVar12 = (ulong)(uint)n_row << 4;
    iVar18 = 0;
    iVar23 = 0;
    local_b4 = 0;
    iVar15 = 1;
    do {
      iVar22 = local_b4 + -1;
      lVar28 = (long)local_b4;
      do {
        lVar33 = lVar28;
        iVar4 = head[lVar33];
        iVar22 = iVar22 + 1;
        if (n_col <= lVar33) break;
        lVar28 = lVar33 + 1;
      } while (iVar4 == -1);
      iVar11 = Col[iVar4].shared4.degree_next;
      head[lVar33] = iVar11;
      if ((long)iVar11 != -1) {
        Col[iVar11].shared3.headhash = -1;
      }
      pCVar1 = Col + iVar4;
      iVar4 = (pCVar1->shared1).thickness;
      iVar11 = (pCVar1->shared2).score;
      (pCVar1->shared2).score = iVar23;
      iVar23 = iVar23 + iVar4;
      iVar29 = n_col - iVar23;
      if (iVar11 < n_col - iVar23) {
        iVar29 = iVar11;
      }
      if ((int)(iVar29 + local_7c) < Alen) {
        uVar13 = (ulong)local_7c;
      }
      else {
        paVar19 = (anon_union_4_2_a9a27649_for_shared2 *)A;
        if (0 < n_col) {
          uVar13 = 0;
          do {
            uVar27 = Col[uVar13].start;
            if (-1 < (int)uVar27) {
              pCVar2 = Col + uVar13;
              uVar16 = (ulong)((long)paVar19 - (long)A) >> 2;
              pCVar2->start = (int)uVar16;
              iVar15 = pCVar2->length;
              if (0 < iVar15) {
                lVar28 = 0;
                do {
                  if (-1 < Row[A[(ulong)uVar27 + lVar28]].shared2.mark) {
                    paVar19->mark = A[(ulong)uVar27 + lVar28];
                    paVar19 = paVar19 + 1;
                  }
                  lVar28 = lVar28 + 1;
                } while (iVar15 != (int)lVar28);
                uVar16 = (ulong)(uint)pCVar2->start;
              }
              pCVar2->length = (int)((ulong)((long)paVar19 - (long)(A + uVar16)) >> 2);
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != (uint)n_col);
        }
        if (0 < n_row) {
          iVar15 = -1;
          lVar28 = 0;
          do {
            if ((*(int *)((long)&Row->shared2 + lVar28) < 0) ||
               (*(int *)((long)&Row->length + lVar28) == 0)) {
              *(undefined4 *)((long)&Row->shared2 + lVar28) = 0xffffffff;
            }
            else {
              iVar11 = *(int *)((long)&Row->start + lVar28);
              *(int *)((long)&Row->shared2 + lVar28) = A[iVar11];
              A[iVar11] = iVar15;
            }
            lVar28 = lVar28 + 0x10;
            iVar15 = iVar15 + -1;
          } while (lVar12 != lVar28);
        }
        paVar30 = paVar19;
        while (paVar19 < (anon_union_4_2_a9a27649_for_shared2 *)(A + (int)local_7c)) {
          if (paVar19->mark < 0) {
            uVar27 = ~paVar19->mark;
            *paVar19 = Row[uVar27].shared2;
            uVar13 = (ulong)((long)paVar30 - (long)A) >> 2;
            Row[uVar27].start = (int)uVar13;
            iVar15 = Row[uVar27].length;
            if (0 < iVar15) {
              do {
                if (-1 < Col[paVar19->mark].start) {
                  paVar30->mark = paVar19->mark;
                  paVar30 = paVar30 + 1;
                }
                paVar19 = paVar19 + 1;
                iVar15 = iVar15 + -1;
              } while (iVar15 != 0);
              uVar13 = (ulong)(uint)Row[uVar27].start;
            }
            Row[uVar27].length = (int)((ulong)((long)paVar30 - (long)(A + uVar13)) >> 2);
          }
          else {
            paVar19 = paVar19 + 1;
          }
        }
        uVar13 = (ulong)((long)paVar30 - (long)A) >> 2;
        iVar18 = iVar18 + 1;
        iVar15 = 1;
        if (0 < n_row) {
          lVar28 = 0;
          do {
            if (-1 < *(int *)((long)&Row->shared2 + lVar28)) {
              *(undefined4 *)((long)&Row->shared2 + lVar28) = 0;
            }
            lVar28 = lVar28 + 0x10;
          } while (lVar12 != lVar28);
        }
      }
      uVar27 = (uint)uVar13;
      (pCVar1->shared1).thickness = -iVar4;
      if ((long)pCVar1->length < 1) {
        (pCVar1->shared1).thickness = iVar4;
        local_c0 = 0;
        local_7c = uVar27;
        if (max_deg < 1) {
          max_deg = 0;
        }
      }
      else {
        piVar10 = A + pCVar1->start;
        piVar14 = piVar10 + pCVar1->length;
        local_c0 = 0;
        uVar13 = uVar13 & 0xffffffff;
        do {
          if (-1 < Row[*piVar10].shared2.mark) {
            lVar28 = (long)Row[*piVar10].length;
            if (0 < lVar28) {
              piVar31 = A + Row[*piVar10].start;
              piVar32 = piVar31 + lVar28;
              do {
                iVar11 = *piVar31;
                iVar29 = Col[iVar11].shared1.thickness;
                if ((0 < iVar29) && (-1 < Col[iVar11].start)) {
                  Col[iVar11].shared1.thickness = -iVar29;
                  iVar21 = (int)uVar13;
                  uVar13 = (ulong)(iVar21 + 1);
                  A[iVar21] = iVar11;
                  local_c0 = local_c0 + iVar29;
                }
                piVar31 = piVar31 + 1;
              } while (piVar31 < piVar32);
            }
          }
          piVar10 = piVar10 + 1;
        } while (piVar10 < piVar14);
        local_7c = (uint)uVar13;
        if (max_deg <= local_c0) {
          max_deg = local_c0;
        }
        (pCVar1->shared1).thickness = iVar4;
        if (0 < (long)pCVar1->length) {
          piVar10 = A + pCVar1->start;
          piVar14 = piVar10 + pCVar1->length;
          do {
            iVar4 = *piVar10;
            piVar10 = piVar10 + 1;
            Row[iVar4].shared2.mark = -1;
          } while (piVar10 < piVar14);
        }
      }
      uVar24 = local_7c - uVar27;
      if (uVar24 == 0 || (int)local_7c < (int)uVar27) {
        local_a0 = A + (int)uVar27;
        local_88 = local_a0 + (int)uVar24;
        local_b8 = -1;
      }
      else {
        local_b8 = A[pCVar1->start];
        local_a0 = A + (int)uVar27;
        local_88 = local_a0 + uVar24;
        piVar10 = local_a0;
        do {
          pCVar2 = Col + *piVar10;
          iVar4 = (pCVar2->shared1).thickness;
          iVar11 = (pCVar2->shared4).degree_next;
          (pCVar2->shared1).thickness = -iVar4;
          iVar29 = (pCVar2->shared3).headhash;
          if ((long)iVar29 == -1) {
            paVar26 = (anon_union_4_2_db423fdf_for_shared4 *)(head + (pCVar2->shared2).score);
          }
          else {
            paVar26 = &Col[iVar29].shared4;
          }
          paVar26->degree_next = iVar11;
          if (iVar11 != -1) {
            Col[iVar11].shared3.headhash = iVar29;
          }
          if (0 < (long)pCVar2->length) {
            piVar14 = A + pCVar2->start;
            piVar31 = piVar14 + pCVar2->length;
            do {
              iVar11 = *piVar14;
              if (-1 < Row[iVar11].shared2.mark) {
                iVar29 = Row[iVar11].shared2.mark - iVar15;
                if (iVar29 < 0) {
                  iVar29 = Row[iVar11].shared1.degree;
                }
                iVar29 = iVar29 + iVar4;
                uVar25 = iVar29 + iVar15;
                uVar8 = -(uint)(iVar29 == 0) | uVar25;
                if (aggressive == 0) {
                  uVar8 = uVar25;
                }
                Row[iVar11].shared2.mark = uVar8;
              }
              piVar14 = piVar14 + 1;
            } while (piVar14 < piVar31);
          }
          piVar10 = piVar10 + 1;
        } while (piVar10 < local_88);
        piVar10 = local_a0;
        if (0 < (int)uVar24) {
          do {
            iVar4 = *piVar10;
            pCVar2 = Col + iVar4;
            piVar14 = A + pCVar2->start;
            piVar31 = piVar14 + pCVar2->length;
            uVar8 = 0;
            piVar32 = piVar14;
            iVar11 = 0;
            while (piVar14 < piVar31) {
              iVar29 = *piVar14;
              piVar14 = piVar14 + 1;
              iVar21 = Row[iVar29].shared2.mark;
              if (-1 < iVar21) {
                *piVar32 = iVar29;
                piVar32 = piVar32 + 1;
                uVar8 = uVar8 + iVar29;
                iVar11 = (iVar11 - iVar15) + iVar21;
                if (n_col <= iVar11) {
                  iVar11 = n_col;
                }
              }
            }
            iVar29 = (int)((ulong)((long)piVar32 - (long)(A + (uint)pCVar2->start)) >> 2);
            pCVar2->length = iVar29;
            if (iVar29 == 0) {
              pCVar2->start = -1;
              local_c0 = local_c0 - (pCVar2->shared1).thickness;
              (pCVar2->shared2).score = iVar23;
              iVar23 = iVar23 + (pCVar2->shared1).thickness;
            }
            else {
              (pCVar2->shared2).score = iVar11;
              uVar13 = (ulong)uVar8 % (ulong)(n_col + 1);
              lVar28 = (long)head[uVar13];
              if (lVar28 < 0) {
                aVar9.headhash = -2 - head[uVar13];
                head[uVar13] = -2 - iVar4;
              }
              else {
                aVar9 = Col[lVar28].shared3;
                Col[lVar28].shared3.headhash = iVar4;
              }
              pCVar2->shared4 = (anon_union_4_2_db423fdf_for_shared4)aVar9;
              (pCVar2->shared3).headhash = (int)uVar13;
            }
            piVar10 = piVar10 + 1;
          } while (piVar10 < local_88);
          piVar10 = local_a0;
          if (0 < (int)uVar24) {
            do {
              if (-1 < Col[*piVar10].start) {
                iVar4 = Col[*piVar10].shared3.headhash;
                iVar11 = head[iVar4];
                lVar28 = (long)iVar11;
                if (lVar28 < 0) {
                  iVar29 = -2 - iVar11;
                }
                else {
                  iVar29 = Col[lVar28].shared3.headhash;
                }
                while (iVar29 != -1) {
                  iVar21 = Col[iVar29].shared4.degree_next;
                  if (iVar21 == -1) break;
                  pCVar2 = Col + iVar29;
                  iVar5 = pCVar2->length;
                  iVar7 = iVar29;
                  do {
                    pCVar3 = Col + iVar21;
                    iVar17 = iVar21;
                    if ((pCVar3->length == iVar5) &&
                       ((pCVar3->shared2).score == (pCVar2->shared2).score)) {
                      if (iVar5 < 1) {
                        lVar33 = 0;
LAB_0010d61d:
                        if ((int)lVar33 != iVar5) goto LAB_0010d64c;
                      }
                      else {
                        lVar33 = 0;
                        do {
                          if (A[pCVar2->start + lVar33] != A[pCVar3->start + lVar33])
                          goto LAB_0010d61d;
                          lVar33 = lVar33 + 1;
                        } while (iVar5 != (int)lVar33);
                      }
                      (pCVar2->shared1).thickness =
                           (pCVar2->shared1).thickness + (pCVar3->shared1).thickness;
                      (pCVar3->shared1).thickness = iVar29;
                      pCVar3->start = -2;
                      (pCVar3->shared2).score = -1;
                      Col[iVar7].shared4 = pCVar3->shared4;
                      iVar17 = iVar7;
                    }
LAB_0010d64c:
                    iVar21 = (pCVar3->shared4).degree_next;
                    iVar7 = iVar17;
                  } while (iVar21 != -1);
                  iVar29 = (pCVar2->shared4).degree_next;
                }
                paVar20 = &Col[lVar28].shared3;
                if (iVar11 < 0) {
                  paVar20 = (anon_union_4_3_eabe2f71_for_shared3 *)(head + iVar4);
                }
                paVar20->headhash = -1;
              }
              piVar10 = piVar10 + 1;
            } while (piVar10 < local_88);
          }
        }
      }
      bVar34 = max_deg + iVar15 < 0;
      iVar15 = max_deg + 1 + iVar15;
      bVar6 = (int)(n_col ^ 0x7fffffffU) <= iVar15;
      if (bVar6 || bVar34) {
        iVar15 = 1;
      }
      pCVar1->start = -1;
      piVar10 = local_a0;
      piVar14 = local_a0;
      if ((0 < n_row) && (bVar6 || bVar34)) {
        lVar28 = 0;
        do {
          if (-1 < *(int *)((long)&Row->shared2 + lVar28)) {
            *(undefined4 *)((long)&Row->shared2 + lVar28) = 0;
          }
          lVar28 = lVar28 + 0x10;
        } while (lVar12 != lVar28);
        iVar15 = 1;
      }
      while (local_b4 = iVar22, piVar14 < local_88) {
        iVar4 = *piVar14;
        piVar14 = piVar14 + 1;
        iVar22 = local_b4;
        if (-1 < Col[iVar4].start) {
          pCVar1 = Col + iVar4;
          *piVar10 = iVar4;
          iVar22 = pCVar1->length;
          pCVar1->length = iVar22 + 1;
          A[(long)pCVar1->start + (long)iVar22] = local_b8;
          iVar11 = n_col - (iVar23 + (pCVar1->shared1).thickness);
          iVar22 = ((pCVar1->shared2).score + local_c0) - (pCVar1->shared1).thickness;
          if (iVar11 <= iVar22) {
            iVar22 = iVar11;
          }
          (pCVar1->shared2).score = iVar22;
          iVar11 = head[iVar22];
          (pCVar1->shared4).degree_next = iVar11;
          (pCVar1->shared3).headhash = -1;
          if ((long)iVar11 != -1) {
            Col[iVar11].shared3.headhash = iVar4;
          }
          piVar10 = piVar10 + 1;
          head[iVar22] = iVar4;
          if (local_b4 < iVar22) {
            iVar22 = local_b4;
          }
        }
      }
      if (0 < local_c0) {
        lVar28 = (long)local_b8;
        Row[lVar28].start = uVar27;
        Row[lVar28].length = (int)((ulong)((long)piVar10 - (long)local_a0) >> 2);
        Row[lVar28].shared1.degree = local_c0;
        Row[lVar28].shared2.mark = 0;
      }
    } while (iVar23 < n_col2);
  }
  return iVar18;
}

Assistant:

PRIVATE Int find_ordering	/* return the number of garbage collections */
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows of A */
    Int n_col,			/* number of columns of A */
    Int Alen,			/* size of A, 2*nnz + n_col or larger */
    Colamd_Row Row [],		/* of size n_row+1 */
    Colamd_Col Col [],		/* of size n_col+1 */
    Int A [],			/* column form and row form of A */
    Int head [],		/* of size n_col+1 */
    Int n_col2,			/* Remaining columns to order */
    Int max_deg,		/* Maximum row degree */
    Int pfree,			/* index of first free slot (2*nnz on entry) */
    Int aggressive
)
{
    /* === Local variables ================================================== */

    Int k ;			/* current pivot ordering step */
    Int pivot_col ;		/* current pivot column */
    Int *cp ;			/* a column pointer */
    Int *rp ;			/* a row pointer */
    Int pivot_row ;		/* current pivot row */
    Int *new_cp ;		/* modified column pointer */
    Int *new_rp ;		/* modified row pointer */
    Int pivot_row_start ;	/* pointer to start of pivot row */
    Int pivot_row_degree ;	/* number of columns in pivot row */
    Int pivot_row_length ;	/* number of supercolumns in pivot row */
    Int pivot_col_score ;	/* score of pivot column */
    Int needed_memory ;		/* free space needed for pivot row */
    Int *cp_end ;		/* pointer to the end of a column */
    Int *rp_end ;		/* pointer to the end of a row */
    Int row ;			/* a row index */
    Int col ;			/* a column index */
    Int max_score ;		/* maximum possible score */
    Int cur_score ;		/* score of current column */
#ifdef DLONG
    uint64_t hash ; 	        /* hash value for supernode detection */
#else
    unsigned Int hash ;		/* hash value for supernode detection */
#endif
    Int head_column ;		/* head of hash bucket */
    Int first_col ;		/* first column in hash bucket */
    Int tag_mark ;		/* marker value for mark array */
    Int row_mark ;		/* Row [row].shared2.mark */
    Int set_difference ;	/* set difference size of row with pivot row */
    Int min_score ;		/* smallest column score */
    Int col_thickness ;		/* "thickness" (no. of columns in a supercol) */
    Int max_mark ;		/* maximum value of tag_mark */
    Int pivot_col_thickness ;	/* number of columns represented by pivot col */
    Int prev_col ;		/* Used by Dlist operations. */
    Int next_col ;		/* Used by Dlist operations. */
    Int ngarbage ;		/* number of garbage collections performed */

#ifndef NDEBUG
    Int debug_d ;		/* debug loop counter */
    Int debug_step = 0 ;	/* debug loop counter */
#endif /* NDEBUG */

    /* === Initialization and clear mark ==================================== */

    max_mark = INT_MAX - n_col ;	/* INT_MAX defined in <limits.h> */
    tag_mark = clear_mark (0, max_mark, n_row, Row) ;
    min_score = 0 ;
    ngarbage = 0 ;
    DEBUG1 (("colamd: Ordering, n_col2=%d\n", n_col2)) ;

    /* === Order the columns ================================================ */

    for (k = 0 ; k < n_col2 ; /* 'k' is incremented below */)
    {

#ifndef NDEBUG
	if (debug_step % 100 == 0)
	{
	    DEBUG2 (("\n...       Step k: %d out of n_col2: %d\n", k, n_col2)) ;
	}
	else
	{
	    DEBUG3 (("\n----------Step k: %d out of n_col2: %d\n", k, n_col2)) ;
	}
	debug_step++ ;
	debug_deg_lists (n_row, n_col, Row, Col, head,
		min_score, n_col2-k, max_deg) ;
	debug_matrix (n_row, n_col, Row, Col, A) ;
#endif /* NDEBUG */

	/* === Select pivot column, and order it ============================ */

	/* make sure degree list isn't empty */
	ASSERT (min_score >= 0) ;
	ASSERT (min_score <= n_col) ;
	ASSERT (head [min_score] >= COLAMD_EMPTY) ;

#ifndef NDEBUG
	for (debug_d = 0 ; debug_d < min_score ; debug_d++)
	{
	    ASSERT (head [debug_d] == COLAMD_EMPTY) ;
	}
#endif /* NDEBUG */

	/* get pivot column from head of minimum degree list */
	while (head [min_score] == COLAMD_EMPTY && min_score < n_col)
	{
	    min_score++ ;
	}
	pivot_col = head [min_score] ;
	ASSERT (pivot_col >= 0 && pivot_col <= n_col) ;
	next_col = Col [pivot_col].shared4.degree_next ;
	head [min_score] = next_col ;
	if (next_col != COLAMD_EMPTY)
	{
	    Col [next_col].shared3.prev = COLAMD_EMPTY ;
	}

	ASSERT (COL_IS_ALIVE (pivot_col)) ;

	/* remember score for defrag check */
	pivot_col_score = Col [pivot_col].shared2.score ;

	/* the pivot column is the kth column in the pivot order */
	Col [pivot_col].shared2.order = k ;

	/* increment order count by column thickness */
	pivot_col_thickness = Col [pivot_col].shared1.thickness ;
	k += pivot_col_thickness ;
	ASSERT (pivot_col_thickness > 0) ;
	DEBUG3 (("Pivot col: %d thick %d\n", pivot_col, pivot_col_thickness)) ;

	/* === Garbage_collection, if necessary ============================= */

	needed_memory = MIN (pivot_col_score, n_col - k) ;
	if (pfree + needed_memory >= Alen)
	{
	    pfree = garbage_collection (n_row, n_col, Row, Col, A, &A [pfree]) ;
	    ngarbage++ ;
	    /* after garbage collection we will have enough */
	    ASSERT (pfree + needed_memory < Alen) ;
	    /* garbage collection has wiped out the Row[].shared2.mark array */
	    tag_mark = clear_mark (0, max_mark, n_row, Row) ;

#ifndef NDEBUG
	    debug_matrix (n_row, n_col, Row, Col, A) ;
#endif /* NDEBUG */
	}

	/* === Compute pivot row pattern ==================================== */

	/* get starting location for this new merged row */
	pivot_row_start = pfree ;

	/* initialize new row counts to zero */
	pivot_row_degree = 0 ;

	/* tag pivot column as having been visited so it isn't included */
	/* in merged pivot row */
	Col [pivot_col].shared1.thickness = -pivot_col_thickness ;

	/* pivot row is the union of all rows in the pivot column pattern */
	cp = &A [Col [pivot_col].start] ;
	cp_end = cp + Col [pivot_col].length ;
	while (cp < cp_end)
	{
	    /* get a row */
	    row = *cp++ ;
	    DEBUG4 (("Pivot col pattern %d %d\n", ROW_IS_ALIVE (row), row)) ;
	    /* skip if row is dead */
	    if (ROW_IS_ALIVE (row))
	    {
		rp = &A [Row [row].start] ;
		rp_end = rp + Row [row].length ;
		while (rp < rp_end)
		{
		    /* get a column */
		    col = *rp++ ;
		    /* add the column, if alive and untagged */
		    col_thickness = Col [col].shared1.thickness ;
		    if (col_thickness > 0 && COL_IS_ALIVE (col))
		    {
			/* tag column in pivot row */
			Col [col].shared1.thickness = -col_thickness ;
			ASSERT (pfree < Alen) ;
			/* place column in pivot row */
			A [pfree++] = col ;
			pivot_row_degree += col_thickness ;
		    }
		}
	    }
	}

	/* clear tag on pivot column */
	Col [pivot_col].shared1.thickness = pivot_col_thickness ;
	max_deg = MAX (max_deg, pivot_row_degree) ;

#ifndef NDEBUG
	DEBUG3 (("check2\n")) ;
	debug_mark (n_row, Row, tag_mark, max_mark) ;
#endif /* NDEBUG */

	/* === Kill all rows used to construct pivot row ==================== */

	/* also kill pivot row, temporarily */
	cp = &A [Col [pivot_col].start] ;
	cp_end = cp + Col [pivot_col].length ;
	while (cp < cp_end)
	{
	    /* may be killing an already dead row */
	    row = *cp++ ;
	    DEBUG3 (("Kill row in pivot col: %d\n", row)) ;
	    KILL_ROW (row) ;
	}

	/* === Select a row index to use as the new pivot row =============== */

	pivot_row_length = pfree - pivot_row_start ;
	if (pivot_row_length > 0)
	{
	    /* pick the "pivot" row arbitrarily (first row in col) */
	    pivot_row = A [Col [pivot_col].start] ;
	    DEBUG3 (("Pivotal row is %d\n", pivot_row)) ;
	}
	else
	{
	    /* there is no pivot row, since it is of zero length */
	    pivot_row = COLAMD_EMPTY ;
	    ASSERT (pivot_row_length == 0) ;
	}
	ASSERT (Col [pivot_col].length > 0 || pivot_row_length == 0) ;

	/* === Approximate degree computation =============================== */

	/* Here begins the computation of the approximate degree.  The column */
	/* score is the sum of the pivot row "length", plus the size of the */
	/* set differences of each row in the column minus the pattern of the */
	/* pivot row itself.  The column ("thickness") itself is also */
	/* excluded from the column score (we thus use an approximate */
	/* external degree). */

	/* The time taken by the following code (compute set differences, and */
	/* add them up) is proportional to the size of the data structure */
	/* being scanned - that is, the sum of the sizes of each column in */
	/* the pivot row.  Thus, the amortized time to compute a column score */
	/* is proportional to the size of that column (where size, in this */
	/* context, is the column "length", or the number of row indices */
	/* in that column).  The number of row indices in a column is */
	/* monotonically non-decreasing, from the length of the original */
	/* column on input to colamd. */

	/* === Compute set differences ====================================== */

	DEBUG3 (("** Computing set differences phase. **\n")) ;

	/* pivot row is currently dead - it will be revived later. */

	DEBUG3 (("Pivot row: ")) ;
	/* for each column in pivot row */
	rp = &A [pivot_row_start] ;
	rp_end = rp + pivot_row_length ;
	while (rp < rp_end)
	{
	    col = *rp++ ;
	    ASSERT (COL_IS_ALIVE (col) && col != pivot_col) ;
	    DEBUG3 (("Col: %d\n", col)) ;

	    /* clear tags used to construct pivot row pattern */
	    col_thickness = -Col [col].shared1.thickness ;
	    ASSERT (col_thickness > 0) ;
	    Col [col].shared1.thickness = col_thickness ;

	    /* === Remove column from degree list =========================== */

	    cur_score = Col [col].shared2.score ;
	    prev_col = Col [col].shared3.prev ;
	    next_col = Col [col].shared4.degree_next ;
	    ASSERT (cur_score >= 0) ;
	    ASSERT (cur_score <= n_col) ;
	    ASSERT (cur_score >= COLAMD_EMPTY) ;
	    if (prev_col == COLAMD_EMPTY)
	    {
		head [cur_score] = next_col ;
	    }
	    else
	    {
		Col [prev_col].shared4.degree_next = next_col ;
	    }
	    if (next_col != COLAMD_EMPTY)
	    {
		Col [next_col].shared3.prev = prev_col ;
	    }

	    /* === Scan the column ========================================== */

	    cp = &A [Col [col].start] ;
	    cp_end = cp + Col [col].length ;
	    while (cp < cp_end)
	    {
		/* get a row */
		row = *cp++ ;
		row_mark = Row [row].shared2.mark ;
		/* skip if dead */
		if (ROW_IS_MARKED_DEAD (row_mark))
		{
		    continue ;
		}
		ASSERT (row != pivot_row) ;
		set_difference = row_mark - tag_mark ;
		/* check if the row has been seen yet */
		if (set_difference < 0)
		{
		    ASSERT (Row [row].shared1.degree <= max_deg) ;
		    set_difference = Row [row].shared1.degree ;
		}
		/* subtract column thickness from this row's set difference */
		set_difference -= col_thickness ;
		ASSERT (set_difference >= 0) ;
		/* absorb this row if the set difference becomes zero */
		if (set_difference == 0 && aggressive)
		{
		    DEBUG3 (("aggressive absorption. Row: %d\n", row)) ;
		    KILL_ROW (row) ;
		}
		else
		{
		    /* save the new mark */
		    Row [row].shared2.mark = set_difference + tag_mark ;
		}
	    }
	}

#ifndef NDEBUG
	debug_deg_lists (n_row, n_col, Row, Col, head,
		min_score, n_col2-k-pivot_row_degree, max_deg) ;
#endif /* NDEBUG */

	/* === Add up set differences for each column ======================= */

	DEBUG3 (("** Adding set differences phase. **\n")) ;

	/* for each column in pivot row */
	rp = &A [pivot_row_start] ;
	rp_end = rp + pivot_row_length ;
	while (rp < rp_end)
	{
	    /* get a column */
	    col = *rp++ ;
	    ASSERT (COL_IS_ALIVE (col) && col != pivot_col) ;
	    hash = 0 ;
	    cur_score = 0 ;
	    cp = &A [Col [col].start] ;
	    /* compact the column */
	    new_cp = cp ;
	    cp_end = cp + Col [col].length ;

	    DEBUG4 (("Adding set diffs for Col: %d.\n", col)) ;

	    while (cp < cp_end)
	    {
		/* get a row */
		row = *cp++ ;
		ASSERT(row >= 0 && row < n_row) ;
		row_mark = Row [row].shared2.mark ;
		/* skip if dead */
		if (ROW_IS_MARKED_DEAD (row_mark))
		{
		    DEBUG4 ((" Row %d, dead\n", row)) ;
		    continue ;
		}
		DEBUG4 ((" Row %d, set diff %d\n", row, row_mark-tag_mark));
		ASSERT (row_mark >= tag_mark) ;
		/* compact the column */
		*new_cp++ = row ;
		/* compute hash function */
		hash += row ;
		/* add set difference */
		cur_score += row_mark - tag_mark ;
		/* integer overflow... */
		cur_score = MIN (cur_score, n_col) ;
	    }

	    /* recompute the column's length */
	    Col [col].length = (Int) (new_cp - &A [Col [col].start]) ;

	    /* === Further mass elimination ================================= */

	    if (Col [col].length == 0)
	    {
		DEBUG4 (("further mass elimination. Col: %d\n", col)) ;
		/* nothing left but the pivot row in this column */
		KILL_PRINCIPAL_COL (col) ;
		pivot_row_degree -= Col [col].shared1.thickness ;
		ASSERT (pivot_row_degree >= 0) ;
		/* order it */
		Col [col].shared2.order = k ;
		/* increment order count by column thickness */
		k += Col [col].shared1.thickness ;
	    }
	    else
	    {
		/* === Prepare for supercolumn detection ==================== */

		DEBUG4 (("Preparing supercol detection for Col: %d.\n", col)) ;

		/* save score so far */
		Col [col].shared2.score = cur_score ;

		/* add column to hash table, for supercolumn detection */
		hash %= n_col + 1 ;

		DEBUG4 ((" Hash = %d, n_col = %d.\n", hash, n_col)) ;
		ASSERT (((Int) hash) <= n_col) ;

		head_column = head [hash] ;
		if (head_column > COLAMD_EMPTY)
		{
		    /* degree list "hash" is non-empty, use prev (shared3) of */
		    /* first column in degree list as head of hash bucket */
		    first_col = Col [head_column].shared3.headhash ;
		    Col [head_column].shared3.headhash = col ;
		}
		else
		{
		    /* degree list "hash" is empty, use head as hash bucket */
		    first_col = - (head_column + 2) ;
		    head [hash] = - (col + 2) ;
		}
		Col [col].shared4.hash_next = first_col ;

		/* save hash function in Col [col].shared3.hash */
		Col [col].shared3.hash = (Int) hash ;
		ASSERT (COL_IS_ALIVE (col)) ;
	    }
	}

	/* The approximate external column degree is now computed.  */

	/* === Supercolumn detection ======================================== */

	DEBUG3 (("** Supercolumn detection phase. **\n")) ;

	detect_super_cols (

#ifndef NDEBUG
		n_col, Row,
#endif /* NDEBUG */

		Col, A, head, pivot_row_start, pivot_row_length) ;

	/* === Kill the pivotal column ====================================== */

	KILL_PRINCIPAL_COL (pivot_col) ;

	/* === Clear mark =================================================== */

	tag_mark = clear_mark (tag_mark+max_deg+1, max_mark, n_row, Row) ;

#ifndef NDEBUG
	DEBUG3 (("check3\n")) ;
	debug_mark (n_row, Row, tag_mark, max_mark) ;
#endif /* NDEBUG */

	/* === Finalize the new pivot row, and column scores ================ */

	DEBUG3 (("** Finalize scores phase. **\n")) ;

	/* for each column in pivot row */
	rp = &A [pivot_row_start] ;
	/* compact the pivot row */
	new_rp = rp ;
	rp_end = rp + pivot_row_length ;
	while (rp < rp_end)
	{
	    col = *rp++ ;
	    /* skip dead columns */
	    if (COL_IS_DEAD (col))
	    {
		continue ;
	    }
	    *new_rp++ = col ;
	    /* add new pivot row to column */
	    A [Col [col].start + (Col [col].length++)] = pivot_row ;

	    /* retrieve score so far and add on pivot row's degree. */
	    /* (we wait until here for this in case the pivot */
	    /* row's degree was reduced due to mass elimination). */
	    cur_score = Col [col].shared2.score + pivot_row_degree ;

	    /* calculate the max possible score as the number of */
	    /* external columns minus the 'k' value minus the */
	    /* columns thickness */
	    max_score = n_col - k - Col [col].shared1.thickness ;

	    /* make the score the external degree of the union-of-rows */
	    cur_score -= Col [col].shared1.thickness ;

	    /* make sure score is less or equal than the max score */
	    cur_score = MIN (cur_score, max_score) ;
	    ASSERT (cur_score >= 0) ;

	    /* store updated score */
	    Col [col].shared2.score = cur_score ;

	    /* === Place column back in degree list ========================= */

	    ASSERT (min_score >= 0) ;
	    ASSERT (min_score <= n_col) ;
	    ASSERT (cur_score >= 0) ;
	    ASSERT (cur_score <= n_col) ;
	    ASSERT (head [cur_score] >= COLAMD_EMPTY) ;
	    next_col = head [cur_score] ;
	    Col [col].shared4.degree_next = next_col ;
	    Col [col].shared3.prev = COLAMD_EMPTY ;
	    if (next_col != COLAMD_EMPTY)
	    {
		Col [next_col].shared3.prev = col ;
	    }
	    head [cur_score] = col ;

	    /* see if this score is less than current min */
	    min_score = MIN (min_score, cur_score) ;

	}

#ifndef NDEBUG
	debug_deg_lists (n_row, n_col, Row, Col, head,
		min_score, n_col2-k, max_deg) ;
#endif /* NDEBUG */

	/* === Resurrect the new pivot row ================================== */

	if (pivot_row_degree > 0)
	{
	    /* update pivot row length to reflect any cols that were killed */
	    /* during super-col detection and mass elimination */
	    Row [pivot_row].start  = pivot_row_start ;
	    Row [pivot_row].length = (Int) (new_rp - &A[pivot_row_start]) ;
	    ASSERT (Row [pivot_row].length > 0) ;
	    Row [pivot_row].shared1.degree = pivot_row_degree ;
	    Row [pivot_row].shared2.mark = 0 ;
	    /* pivot row is no longer dead */

	    DEBUG1 (("Resurrect Pivot_row %d deg: %d\n",
			pivot_row, pivot_row_degree)) ;
	}
    }

    /* === All principal columns have now been ordered ====================== */

    return (ngarbage) ;
}